

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O0

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* cppqc::ArbitraryImpl<std::vector<int,_std::allocator<int>_>_>::shrink
            (vector<int,_std::allocator<int>_> *v)

{
  vector<int,_std::allocator<int>_> *in_RDI;
  vector<int,_std::allocator<int>_> *this;
  Arbitrary<int> *in_stack_ffffffffffffffc8;
  StatelessGenerator<int> *in_stack_ffffffffffffffd0;
  StatelessGenerator<int> *in_stack_ffffffffffffffd8;
  
  this = in_RDI;
  StatelessGenerator<int>::StatelessGenerator<cppqc::Arbitrary<int>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  listOf<int>(in_stack_ffffffffffffffd8);
  StatelessGenerator<std::vector<int,_std::allocator<int>_>_>::shrink
            ((StatelessGenerator<std::vector<int,_std::allocator<int>_>_> *)this,in_RDI);
  StatelessGenerator<std::vector<int,_std::allocator<int>_>_>::~StatelessGenerator
            ((StatelessGenerator<std::vector<int,_std::allocator<int>_>_> *)0x127e50);
  StatelessGenerator<int>::~StatelessGenerator((StatelessGenerator<int> *)0x127e5a);
  return (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *)this;
}

Assistant:

static std::vector<std::vector<T>> shrink(const std::vector<T>& v) {
    return listOf<T>().shrink(v);
  }